

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  size_t __n;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uchar *local_d0;
  
  sVar9 = hash->bytes;
  hash->bytes = sVar9 + len;
  uVar36 = (ulong)((uint)sVar9 & 0x3f);
  local_d0 = data;
  while (0x3f < uVar36 + len) {
    __n = 0x40 - uVar36;
    memcpy((void *)((long)hash->buf + uVar36),local_d0,__n);
    local_d0 = local_d0 + __n;
    len = len - __n;
    uVar1 = hash->s[0];
    uVar2 = hash->s[1];
    uVar3 = hash->s[2];
    uVar4 = hash->s[3];
    uVar5 = hash->s[4];
    uVar6 = hash->s[5];
    uVar7 = hash->s[6];
    uVar8 = hash->s[7];
    uVar15 = hash->buf[0];
    uVar25 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    iVar12 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 +
             ((uVar5 << 7 | uVar5 >> 0x19) ^
             (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6));
    uVar13 = iVar12 + uVar25 + uVar4 + 0x428a2f98;
    uVar10 = ((uVar2 | uVar1) & uVar3 | uVar2 & uVar1) +
             ((uVar1 << 10 | uVar1 >> 0x16) ^
             (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
             uVar25 + iVar12 + 0x428a2f98;
    uVar26 = (uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6);
    uVar15 = hash->buf[1];
    uVar24 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8;
    uVar30 = uVar24 | uVar15 << 0x18;
    iVar12 = ((uVar6 ^ uVar5) & uVar13 ^ uVar6) + uVar30 + uVar7;
    uVar41 = iVar12 + uVar26 + uVar3 + 0x71374491;
    uVar16 = ((uVar10 | uVar1) & uVar2 | uVar10 & uVar1) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) +
             uVar26 + iVar12 + 0x71374491;
    uVar27 = (uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6);
    uVar26 = hash->buf[2];
    uVar29 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8;
    uVar37 = uVar29 | uVar26 << 0x18;
    iVar12 = ((uVar13 ^ uVar5) & uVar41 ^ uVar5) + uVar37 + uVar6;
    uVar28 = ((uVar16 | uVar10) & uVar1 | uVar16 & uVar10) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) +
             iVar12 + uVar27 + -0x4a3f0431;
    uVar43 = iVar12 + uVar27 + uVar2 + 0xb5c0fbcf;
    uVar31 = (uVar43 * 0x80 | uVar43 >> 0x19) ^
             (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6);
    uVar27 = hash->buf[3];
    uVar35 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8;
    uVar48 = uVar35 | uVar27 << 0x18;
    iVar12 = ((uVar41 ^ uVar13) & uVar43 ^ uVar13) + uVar48 + uVar5;
    uVar32 = ((uVar28 | uVar16) & uVar10 | uVar28 & uVar16) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) +
             iVar12 + uVar31 + -0x164a245b;
    uVar49 = iVar12 + uVar31 + uVar1 + 0xe9b5dba5;
    uVar31 = hash->buf[4];
    uVar47 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8;
    uVar19 = uVar47 | uVar31 << 0x18;
    iVar12 = uVar13 + uVar19 + ((uVar43 ^ uVar41) & uVar49 ^ uVar41) +
             ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) + 0x3956c25b;
    uVar10 = uVar10 + iVar12;
    uVar38 = ((uVar32 | uVar28) & uVar16 | uVar32 & uVar28) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar12;
    uVar13 = hash->buf[5];
    uVar53 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8;
    uVar20 = uVar53 | uVar13 << 0x18;
    iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
             uVar41 + uVar20 + ((uVar49 ^ uVar43) & uVar10 ^ uVar43) + 0x59f111f1;
    uVar16 = uVar16 + iVar12;
    uVar42 = ((uVar38 | uVar32) & uVar28 | uVar38 & uVar32) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
    uVar41 = hash->buf[6];
    uVar54 = uVar41 >> 0x18 | (uVar41 & 0xff0000) >> 8 | (uVar41 & 0xff00) << 8;
    uVar21 = uVar54 | uVar41 << 0x18;
    iVar12 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
             uVar43 + uVar21 + ((uVar10 ^ uVar49) & uVar16 ^ uVar49) + -0x6dc07d5c;
    uVar28 = uVar28 + iVar12;
    uVar17 = ((uVar42 | uVar38) & uVar32 | uVar42 & uVar38) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
    uVar43 = hash->buf[7];
    uVar56 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8;
    uVar22 = uVar56 | uVar43 << 0x18;
    iVar12 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             uVar49 + uVar22 + ((uVar16 ^ uVar10) & uVar28 ^ uVar10) + -0x54e3a12b;
    uVar32 = uVar32 + iVar12;
    uVar59 = ((uVar17 | uVar42) & uVar38 | uVar17 & uVar42) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
    uVar49 = hash->buf[8];
    uVar57 = uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8;
    uVar50 = uVar57 | uVar49 << 0x18;
    iVar12 = uVar10 + uVar50 + ((uVar28 ^ uVar16) & uVar32 ^ uVar16) +
             ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) + -0x27f85568
    ;
    uVar38 = uVar38 + iVar12;
    uVar14 = ((uVar59 | uVar17) & uVar42 | uVar59 & uVar17) +
             ((uVar59 * 0x400 | uVar59 >> 0x16) ^
             (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar12;
    uVar10 = hash->buf[9];
    uVar58 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
    uVar51 = uVar58 | uVar10 << 0x18;
    iVar12 = uVar16 + uVar51 + ((uVar32 ^ uVar28) & uVar38 ^ uVar28) +
             ((uVar38 * 0x80 | uVar38 >> 0x19) ^
             (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) + 0x12835b01;
    uVar42 = uVar42 + iVar12;
    uVar11 = ((uVar14 | uVar59) & uVar17 | uVar14 & uVar59) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
    uVar16 = hash->buf[10];
    uVar61 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8;
    uVar52 = uVar61 | uVar16 << 0x18;
    iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
             uVar28 + uVar52 + ((uVar38 ^ uVar32) & uVar42 ^ uVar32) + 0x243185be;
    uVar17 = uVar17 + iVar12;
    uVar55 = ((uVar11 | uVar14) & uVar59 | uVar11 & uVar14) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar12;
    uVar28 = hash->buf[0xb];
    uVar60 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8;
    uVar44 = uVar60 | uVar28 << 0x18;
    iVar12 = ((uVar17 * 0x80 | uVar17 >> 0x19) ^
             (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) +
             uVar32 + uVar44 + ((uVar42 ^ uVar38) & uVar17 ^ uVar38) + 0x550c7dc3;
    uVar59 = uVar59 + iVar12;
    uVar45 = ((uVar55 | uVar11) & uVar14 | uVar55 & uVar11) +
             ((uVar55 * 0x400 | uVar55 >> 0x16) ^
             (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar12;
    uVar32 = hash->buf[0xc];
    uVar62 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8;
    uVar33 = uVar62 | uVar32 << 0x18;
    iVar12 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
             (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
             uVar38 + uVar33 + ((uVar17 ^ uVar42) & uVar59 ^ uVar42) + 0x72be5d74;
    uVar14 = uVar14 + iVar12;
    uVar39 = ((uVar45 | uVar55) & uVar11 | uVar45 & uVar55) +
             ((uVar45 * 0x400 | uVar45 >> 0x16) ^
             (uVar45 * 0x80000 | uVar45 >> 0xd) ^ (uVar45 * 0x40000000 | uVar45 >> 2)) + iVar12;
    uVar38 = hash->buf[0xd];
    uVar63 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8;
    uVar34 = uVar63 | uVar38 << 0x18;
    iVar12 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
             (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
             uVar42 + uVar34 + ((uVar59 ^ uVar17) & uVar14 ^ uVar17) + -0x7f214e02;
    uVar11 = uVar11 + iVar12;
    uVar23 = ((uVar39 | uVar45) & uVar55 | uVar39 & uVar45) +
             ((uVar39 * 0x400 | uVar39 >> 0x16) ^
             (uVar39 * 0x80000 | uVar39 >> 0xd) ^ (uVar39 * 0x40000000 | uVar39 >> 2)) + iVar12;
    uVar42 = hash->buf[0xe];
    uVar64 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
    uVar46 = uVar64 | uVar42 << 0x18;
    iVar12 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
             uVar17 + uVar46 + ((uVar14 ^ uVar59) & uVar11 ^ uVar59) + -0x6423f959;
    uVar55 = uVar55 + iVar12;
    uVar40 = ((uVar23 | uVar39) & uVar45 | uVar23 & uVar39) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar12;
    uVar17 = hash->buf[0xf];
    uVar65 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8;
    uVar18 = uVar65 | uVar17 << 0x18;
    iVar12 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
             (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
             uVar59 + uVar18 + ((uVar11 ^ uVar14) & uVar55 ^ uVar14) + -0x3e640e8c;
    uVar45 = uVar45 + iVar12;
    uVar59 = ((uVar40 | uVar23) & uVar39 | uVar40 & uVar23) +
             ((uVar40 * 0x400 | uVar40 >> 0x16) ^
             (uVar40 * 0x80000 | uVar40 >> 0xd) ^ (uVar40 * 0x40000000 | uVar40 >> 2)) + iVar12;
    uVar25 = uVar25 + uVar51 +
             (uVar30 >> 3 ^
             (uVar24 << 0xe | uVar30 >> 0x12) ^ ((uVar15 >> 0x18) << 0x19 | uVar30 >> 7)) +
             (uVar46 >> 10 ^ (uVar64 << 0xd | uVar46 >> 0x13) ^ (uVar64 << 0xf | uVar46 >> 0x11));
    iVar12 = uVar14 + uVar25 + ((uVar55 ^ uVar11) & uVar45 ^ uVar11) +
             ((uVar45 * 0x80 | uVar45 >> 0x19) ^
             (uVar45 * 0x200000 | uVar45 >> 0xb) ^ (uVar45 * 0x4000000 | uVar45 >> 6)) + -0x1b64963f
    ;
    uVar39 = uVar39 + iVar12;
    uVar14 = ((uVar59 | uVar40) & uVar23 | uVar59 & uVar40) +
             ((uVar59 * 0x400 | uVar59 >> 0x16) ^
             (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar12;
    uVar30 = uVar30 + uVar52 +
             (uVar37 >> 3 ^
             (uVar29 << 0xe | uVar37 >> 0x12) ^ ((uVar26 >> 0x18) << 0x19 | uVar37 >> 7)) +
             (uVar18 >> 10 ^ (uVar65 << 0xd | uVar18 >> 0x13) ^ (uVar65 << 0xf | uVar18 >> 0x11));
    iVar12 = ((uVar39 * 0x80 | uVar39 >> 0x19) ^
             (uVar39 * 0x200000 | uVar39 >> 0xb) ^ (uVar39 * 0x4000000 | uVar39 >> 6)) +
             uVar11 + uVar30 + ((uVar45 ^ uVar55) & uVar39 ^ uVar55) + -0x1041b87a;
    uVar23 = uVar23 + iVar12;
    uVar11 = ((uVar14 | uVar59) & uVar40 | uVar14 & uVar59) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
    uVar29 = uVar37 + uVar44 +
             (uVar48 >> 3 ^
             (uVar35 << 0xe | uVar48 >> 0x12) ^ ((uVar27 >> 0x18) << 0x19 | uVar48 >> 7)) +
             (uVar25 >> 10 ^ (uVar25 * 0x2000 | uVar25 >> 0x13) ^ (uVar25 * 0x8000 | uVar25 >> 0x11)
             );
    iVar12 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
             uVar55 + uVar29 + ((uVar39 ^ uVar45) & uVar23 ^ uVar45) + 0xfc19dc6;
    uVar40 = uVar40 + iVar12;
    uVar27 = ((uVar11 | uVar14) & uVar59 | uVar11 & uVar14) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar12;
    uVar48 = uVar48 + uVar33 +
             (uVar19 >> 3 ^
             (uVar47 << 0xe | uVar19 >> 0x12) ^ ((uVar31 >> 0x18) << 0x19 | uVar19 >> 7)) +
             (uVar30 >> 10 ^ (uVar30 * 0x2000 | uVar30 >> 0x13) ^ (uVar30 * 0x8000 | uVar30 >> 0x11)
             );
    iVar12 = ((uVar40 * 0x80 | uVar40 >> 0x19) ^
             (uVar40 * 0x200000 | uVar40 >> 0xb) ^ (uVar40 * 0x4000000 | uVar40 >> 6)) +
             uVar45 + uVar48 + ((uVar23 ^ uVar39) & uVar40 ^ uVar39) + 0x240ca1cc;
    uVar59 = uVar59 + iVar12;
    uVar37 = ((uVar27 | uVar11) & uVar14 | uVar27 & uVar11) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar12;
    uVar19 = uVar19 + uVar34 +
             (uVar20 >> 3 ^
             (uVar53 << 0xe | uVar20 >> 0x12) ^ ((uVar13 >> 0x18) << 0x19 | uVar20 >> 7)) +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar12 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
             (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
             uVar39 + uVar19 + ((uVar40 ^ uVar23) & uVar59 ^ uVar23) + 0x2de92c6f;
    uVar14 = uVar14 + iVar12;
    uVar15 = ((uVar37 | uVar27) & uVar11 | uVar37 & uVar27) +
             ((uVar37 * 0x400 | uVar37 >> 0x16) ^
             (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar12;
    uVar24 = uVar20 + uVar46 +
             (uVar21 >> 3 ^
             (uVar54 << 0xe | uVar21 >> 0x12) ^ ((uVar41 >> 0x18) << 0x19 | uVar21 >> 7)) +
             (uVar48 >> 10 ^ (uVar48 * 0x2000 | uVar48 >> 0x13) ^ (uVar48 * 0x8000 | uVar48 >> 0x11)
             );
    iVar12 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
             (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
             uVar23 + uVar24 + ((uVar59 ^ uVar40) & uVar14 ^ uVar40) + 0x4a7484aa;
    uVar11 = uVar11 + iVar12;
    uVar35 = ((uVar15 | uVar37) & uVar27 | uVar15 & uVar37) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    uVar20 = uVar21 + uVar18 +
             (uVar22 >> 3 ^
             (uVar56 << 0xe | uVar22 >> 0x12) ^ ((uVar43 >> 0x18) << 0x19 | uVar22 >> 7)) +
             (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11)
             );
    iVar12 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
             uVar40 + uVar20 + ((uVar14 ^ uVar59) & uVar11 ^ uVar59) + 0x5cb0a9dc;
    uVar27 = uVar27 + iVar12;
    uVar47 = ((uVar35 | uVar15) & uVar37 | uVar35 & uVar15) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
    uVar40 = (uVar50 >> 3 ^
             (uVar57 << 0xe | uVar50 >> 0x12) ^ ((uVar49 >> 0x18) << 0x19 | uVar50 >> 7)) + uVar22 +
             uVar25 + (uVar24 >> 10 ^
                      (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
    iVar12 = ((uVar27 * 0x80 | uVar27 >> 0x19) ^
             (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
             uVar59 + uVar40 + ((uVar11 ^ uVar14) & uVar27 ^ uVar14) + 0x76f988da;
    uVar37 = uVar37 + iVar12;
    uVar13 = ((uVar47 | uVar35) & uVar15 | uVar47 & uVar35) +
             ((uVar47 * 0x400 | uVar47 >> 0x16) ^
             (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar12;
    uVar53 = (uVar51 >> 3 ^
             (uVar58 << 0xe | uVar51 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar51 >> 7)) + uVar50 +
             uVar30 + (uVar20 >> 10 ^
                      (uVar20 * 0x2000 | uVar20 >> 0x13) ^ (uVar20 * 0x8000 | uVar20 >> 0x11));
    iVar12 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
             (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
             uVar14 + uVar53 + ((uVar27 ^ uVar11) & uVar37 ^ uVar11) + -0x67c1aeae;
    uVar15 = uVar15 + iVar12;
    uVar54 = ((uVar13 | uVar47) & uVar35 | uVar13 & uVar47) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar12;
    uVar26 = (uVar52 >> 3 ^
             (uVar61 << 0xe | uVar52 >> 0x12) ^ ((uVar16 >> 0x18) << 0x19 | uVar52 >> 7)) + uVar51 +
             uVar29 + (uVar40 >> 10 ^
                      (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11));
    iVar12 = uVar11 + uVar26 + ((uVar37 ^ uVar27) & uVar15 ^ uVar27) +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) + -0x57ce3993
    ;
    uVar35 = uVar35 + iVar12;
    uVar31 = ((uVar54 | uVar13) & uVar47 | uVar54 & uVar13) +
             ((uVar54 * 0x400 | uVar54 >> 0x16) ^
             (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar12;
    uVar61 = (uVar44 >> 3 ^
             (uVar60 << 0xe | uVar44 >> 0x12) ^ ((uVar28 >> 0x18) << 0x19 | uVar44 >> 7)) + uVar52 +
             uVar48 + (uVar53 >> 10 ^
                      (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
    iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
             (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
             uVar27 + uVar61 + ((uVar15 ^ uVar37) & uVar35 ^ uVar37) + -0x4ffcd838;
    uVar47 = uVar47 + iVar12;
    uVar41 = ((uVar31 | uVar54) & uVar13 | uVar31 & uVar54) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar12;
    uVar27 = (uVar33 >> 3 ^
             (uVar62 << 0xe | uVar33 >> 0x12) ^ ((uVar32 >> 0x18) << 0x19 | uVar33 >> 7)) + uVar44 +
             uVar19 + (uVar26 >> 10 ^
                      (uVar26 * 0x2000 | uVar26 >> 0x13) ^ (uVar26 * 0x8000 | uVar26 >> 0x11));
    iVar12 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
             (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
             uVar37 + uVar27 + ((uVar35 ^ uVar15) & uVar47 ^ uVar15) + -0x40a68039;
    uVar13 = uVar13 + iVar12;
    uVar16 = ((uVar41 | uVar31) & uVar54 | uVar41 & uVar31) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
    uVar62 = (uVar34 >> 3 ^
             (uVar63 << 0xe | uVar34 >> 0x12) ^ ((uVar38 >> 0x18) << 0x19 | uVar34 >> 7)) + uVar33 +
             uVar24 + (uVar61 >> 10 ^
                      (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
    iVar12 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
             uVar15 + uVar62 + ((uVar47 ^ uVar35) & uVar13 ^ uVar35) + -0x391ff40d;
    uVar54 = uVar54 + iVar12;
    uVar43 = ((uVar16 | uVar41) & uVar31 | uVar16 & uVar41) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar12;
    uVar60 = (uVar46 >> 3 ^
             (uVar64 << 0xe | uVar46 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar46 >> 7)) + uVar34 +
             uVar20 + (uVar27 >> 10 ^
                      (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11));
    iVar12 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
             (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
             uVar35 + uVar60 + ((uVar13 ^ uVar47) & uVar54 ^ uVar47) + -0x2a586eb9;
    uVar31 = uVar31 + iVar12;
    uVar49 = ((uVar43 | uVar16) & uVar41 | uVar43 & uVar16) +
             ((uVar43 * 0x400 | uVar43 >> 0x16) ^
             (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
    uVar17 = (uVar18 >> 3 ^
             (uVar65 << 0xe | uVar18 >> 0x12) ^ ((uVar17 >> 0x18) << 0x19 | uVar18 >> 7)) + uVar46 +
             uVar40 + (uVar62 >> 10 ^
                      (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
    iVar12 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar47 + uVar17 + ((uVar54 ^ uVar13) & uVar31 ^ uVar13) + 0x6ca6351;
    uVar41 = uVar41 + iVar12;
    uVar10 = ((uVar49 | uVar43) & uVar16 | uVar49 & uVar43) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar12;
    uVar63 = (uVar25 >> 3 ^ (uVar25 * 0x4000 | uVar25 >> 0x12) ^ (uVar25 * 0x2000000 | uVar25 >> 7))
             + uVar18 + uVar53 +
             (uVar60 >> 10 ^ (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11)
             );
    iVar12 = uVar13 + uVar63 + ((uVar31 ^ uVar54) & uVar41 ^ uVar54) +
             ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) + 0x14292967;
    uVar16 = uVar16 + iVar12;
    uVar35 = ((uVar10 | uVar49) & uVar43 | uVar10 & uVar49) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
    uVar56 = (uVar30 >> 3 ^ (uVar30 * 0x4000 | uVar30 >> 0x12) ^ (uVar30 * 0x2000000 | uVar30 >> 7))
             + uVar25 + uVar26 +
             (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             );
    iVar12 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
             uVar54 + uVar56 + ((uVar41 ^ uVar31) & uVar16 ^ uVar31) + 0x27b70a85;
    uVar43 = uVar43 + iVar12;
    uVar15 = ((uVar35 | uVar10) & uVar49 | uVar35 & uVar10) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar12;
    uVar64 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
             + uVar30 + uVar61 +
             (uVar63 >> 10 ^ (uVar63 * 0x2000 | uVar63 >> 0x13) ^ (uVar63 * 0x8000 | uVar63 >> 0x11)
             );
    iVar12 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
             (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
             uVar31 + uVar64 + ((uVar16 ^ uVar41) & uVar43 ^ uVar41) + 0x2e1b2138;
    uVar49 = uVar49 + iVar12;
    uVar13 = ((uVar15 | uVar35) & uVar10 | uVar15 & uVar35) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    uVar29 = (uVar48 >> 3 ^ (uVar48 * 0x4000 | uVar48 >> 0x12) ^ (uVar48 * 0x2000000 | uVar48 >> 7))
             + uVar29 + uVar27 +
             (uVar56 >> 10 ^ (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11)
             );
    iVar12 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
             uVar41 + uVar29 + ((uVar43 ^ uVar16) & uVar49 ^ uVar16) + 0x4d2c6dfc;
    uVar10 = uVar10 + iVar12;
    uVar32 = ((uVar13 | uVar15) & uVar35 | uVar13 & uVar15) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar12;
    uVar38 = (uVar19 >> 3 ^ (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7))
             + uVar48 + uVar62 +
             (uVar64 >> 10 ^ (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11)
             );
    iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
             uVar16 + uVar38 + ((uVar49 ^ uVar43) & uVar10 ^ uVar43) + 0x53380d13;
    uVar35 = uVar35 + iVar12;
    uVar28 = ((uVar32 | uVar13) & uVar15 | uVar32 & uVar13) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar12;
    uVar57 = (uVar24 >> 3 ^ (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7))
             + uVar19 + uVar60 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar12 = ((uVar35 * 0x80 | uVar35 >> 0x19) ^
             (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6)) +
             uVar43 + uVar57 + ((uVar10 ^ uVar49) & uVar35 ^ uVar49) + 0x650a7354;
    uVar15 = uVar15 + iVar12;
    uVar31 = ((uVar28 | uVar32) & uVar13 | uVar28 & uVar32) +
             ((uVar28 * 0x400 | uVar28 >> 0x16) ^
             (uVar28 * 0x80000 | uVar28 >> 0xd) ^ (uVar28 * 0x40000000 | uVar28 >> 2)) + iVar12;
    uVar65 = (uVar20 >> 3 ^ (uVar20 * 0x4000 | uVar20 >> 0x12) ^ (uVar20 * 0x2000000 | uVar20 >> 7))
             + uVar24 + uVar17 +
             (uVar38 >> 10 ^ (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11)
             );
    iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             uVar49 + uVar65 + ((uVar35 ^ uVar10) & uVar15 ^ uVar10) + 0x766a0abb;
    uVar13 = uVar13 + iVar12;
    uVar42 = ((uVar31 | uVar28) & uVar32 | uVar31 & uVar28) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar12;
    uVar58 = (uVar40 >> 3 ^ (uVar40 * 0x4000 | uVar40 >> 0x12) ^ (uVar40 * 0x2000000 | uVar40 >> 7))
             + uVar20 + uVar63 +
             (uVar57 >> 10 ^ (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11)
             );
    iVar12 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
             uVar10 + uVar58 + ((uVar15 ^ uVar35) & uVar13 ^ uVar35) + -0x7e3d36d2;
    uVar32 = uVar32 + iVar12;
    uVar49 = ((uVar42 | uVar31) & uVar28 | uVar42 & uVar31) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
    uVar11 = (uVar53 >> 3 ^ (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7))
             + uVar40 + uVar56 +
             (uVar65 >> 10 ^ (uVar65 * 0x2000 | uVar65 >> 0x13) ^ (uVar65 * 0x8000 | uVar65 >> 0x11)
             );
    iVar12 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             uVar35 + uVar11 + ((uVar13 ^ uVar15) & uVar32 ^ uVar15) + -0x6d8dd37b;
    uVar28 = uVar28 + iVar12;
    uVar10 = ((uVar49 | uVar42) & uVar31 | uVar49 & uVar42) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar12;
    uVar41 = (uVar26 >> 3 ^ (uVar26 * 0x4000 | uVar26 >> 0x12) ^ (uVar26 * 0x2000000 | uVar26 >> 7))
             + uVar53 + uVar64 +
             (uVar58 >> 10 ^ (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11)
             );
    iVar12 = ((uVar28 * 0x80 | uVar28 >> 0x19) ^
             (uVar28 * 0x200000 | uVar28 >> 0xb) ^ (uVar28 * 0x4000000 | uVar28 >> 6)) +
             uVar15 + uVar41 + ((uVar32 ^ uVar13) & uVar28 ^ uVar13) + -0x5d40175f;
    uVar31 = uVar31 + iVar12;
    uVar15 = ((uVar10 | uVar49) & uVar42 | uVar10 & uVar49) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
    uVar43 = (uVar61 >> 3 ^ (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7))
             + uVar26 + uVar29 +
             (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             );
    iVar12 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar13 + uVar43 + ((uVar28 ^ uVar32) & uVar31 ^ uVar32) + -0x57e599b5;
    uVar42 = uVar42 + iVar12;
    uVar26 = ((uVar15 | uVar10) & uVar49 | uVar15 & uVar10) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    uVar16 = (uVar27 >> 3 ^ (uVar27 * 0x4000 | uVar27 >> 0x12) ^ (uVar27 * 0x2000000 | uVar27 >> 7))
             + uVar61 + uVar38 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             );
    iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
             uVar32 + uVar16 + ((uVar31 ^ uVar28) & uVar42 ^ uVar28) + -0x3db47490;
    uVar49 = uVar49 + iVar12;
    uVar32 = ((uVar26 | uVar15) & uVar10 | uVar26 & uVar15) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar12;
    uVar35 = (uVar62 >> 3 ^ (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7))
             + uVar27 + uVar57 +
             (uVar43 >> 10 ^ (uVar43 * 0x2000 | uVar43 >> 0x13) ^ (uVar43 * 0x8000 | uVar43 >> 0x11)
             );
    iVar12 = ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6)) +
             uVar28 + uVar35 + ((uVar42 ^ uVar31) & uVar49 ^ uVar31) + -0x3893ae5d;
    uVar10 = uVar10 + iVar12;
    uVar61 = ((uVar32 | uVar26) & uVar15 | uVar32 & uVar26) +
             ((uVar32 * 0x400 | uVar32 >> 0x16) ^
             (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar12;
    uVar47 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7))
             + uVar62 + uVar65 +
             (uVar16 >> 10 ^ (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11)
             );
    iVar12 = uVar31 + uVar47 + ((uVar49 ^ uVar42) & uVar10 ^ uVar42) +
             ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + -0x2e6d17e7
    ;
    uVar15 = uVar15 + iVar12;
    uVar62 = ((uVar61 | uVar32) & uVar26 | uVar61 & uVar32) +
             ((uVar61 * 0x400 | uVar61 >> 0x16) ^
             (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar12;
    uVar13 = (uVar17 >> 3 ^ (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7))
             + uVar60 + uVar58 +
             (uVar35 >> 10 ^ (uVar35 * 0x2000 | uVar35 >> 0x13) ^ (uVar35 * 0x8000 | uVar35 >> 0x11)
             );
    iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             uVar42 + uVar13 + ((uVar10 ^ uVar49) & uVar15 ^ uVar49) + -0x2966f9dc;
    uVar26 = uVar26 + iVar12;
    uVar31 = ((uVar62 | uVar61) & uVar32 | uVar62 & uVar61) +
             ((uVar62 * 0x400 | uVar62 >> 0x16) ^
             (uVar62 * 0x80000 | uVar62 >> 0xd) ^ (uVar62 * 0x40000000 | uVar62 >> 2)) + iVar12;
    uVar17 = (uVar63 >> 3 ^ (uVar63 * 0x4000 | uVar63 >> 0x12) ^ (uVar63 * 0x2000000 | uVar63 >> 7))
             + uVar17 + uVar11 +
             (uVar47 >> 10 ^ (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11)
             );
    iVar12 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             uVar49 + uVar17 + ((uVar15 ^ uVar10) & uVar26 ^ uVar10) + -0xbf1ca7b;
    uVar32 = uVar32 + iVar12;
    uVar42 = ((uVar31 | uVar62) & uVar61 | uVar31 & uVar62) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar12;
    uVar28 = (uVar56 >> 3 ^ (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7))
             + uVar63 + uVar41 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             );
    iVar12 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
             (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
             uVar10 + uVar28 + ((uVar26 ^ uVar15) & uVar32 ^ uVar15) + 0x106aa070;
    uVar61 = uVar61 + iVar12;
    uVar53 = ((uVar42 | uVar31) & uVar62 | uVar42 & uVar31) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar12;
    uVar49 = (uVar64 >> 3 ^ (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7))
             + uVar56 + uVar43 +
             (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             );
    iVar12 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
             (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
             uVar15 + uVar49 + ((uVar32 ^ uVar26) & uVar61 ^ uVar26) + 0x19a4c116;
    uVar62 = uVar62 + iVar12;
    uVar54 = ((uVar53 | uVar42) & uVar31 | uVar53 & uVar42) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar12;
    uVar15 = (uVar29 >> 3 ^ (uVar29 * 0x4000 | uVar29 >> 0x12) ^ (uVar29 * 0x2000000 | uVar29 >> 7))
             + uVar64 + uVar16 +
             (uVar28 >> 10 ^ (uVar28 * 0x2000 | uVar28 >> 0x13) ^ (uVar28 * 0x8000 | uVar28 >> 0x11)
             );
    iVar12 = ((uVar62 * 0x80 | uVar62 >> 0x19) ^
             (uVar62 * 0x200000 | uVar62 >> 0xb) ^ (uVar62 * 0x4000000 | uVar62 >> 6)) +
             uVar26 + uVar15 + ((uVar61 ^ uVar32) & uVar62 ^ uVar32) + 0x1e376c08;
    uVar31 = uVar31 + iVar12;
    uVar24 = ((uVar54 | uVar53) & uVar42 | uVar54 & uVar53) +
             ((uVar54 * 0x400 | uVar54 >> 0x16) ^
             (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar12;
    uVar27 = (uVar38 >> 3 ^ (uVar38 * 0x4000 | uVar38 >> 0x12) ^ (uVar38 * 0x2000000 | uVar38 >> 7))
             + uVar29 + uVar35 +
             (uVar49 >> 10 ^ (uVar49 * 0x2000 | uVar49 >> 0x13) ^ (uVar49 * 0x8000 | uVar49 >> 0x11)
             );
    iVar12 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar32 + uVar27 + ((uVar62 ^ uVar61) & uVar31 ^ uVar61) + 0x2748774c;
    uVar42 = uVar42 + iVar12;
    uVar60 = ((uVar24 | uVar54) & uVar53 | uVar24 & uVar54) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar12;
    uVar32 = (uVar57 >> 3 ^ (uVar57 * 0x4000 | uVar57 >> 0x12) ^ (uVar57 * 0x2000000 | uVar57 >> 7))
             + uVar38 + uVar47 +
             (uVar15 >> 10 ^ (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11)
             );
    iVar12 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
             uVar61 + uVar32 + ((uVar31 ^ uVar62) & uVar42 ^ uVar62) + 0x34b0bcb5;
    uVar53 = uVar53 + iVar12;
    uVar10 = ((uVar60 | uVar24) & uVar54 | uVar60 & uVar24) +
             ((uVar60 * 0x400 | uVar60 >> 0x16) ^
             (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar12;
    uVar29 = (uVar65 >> 3 ^ (uVar65 * 0x4000 | uVar65 >> 0x12) ^ (uVar65 * 0x2000000 | uVar65 >> 7))
             + uVar57 + uVar13 +
             (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11)
             );
    iVar12 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
             uVar62 + uVar29 + ((uVar42 ^ uVar31) & uVar53 ^ uVar31) + 0x391c0cb3;
    uVar54 = uVar54 + iVar12;
    uVar61 = ((uVar10 | uVar60) & uVar24 | uVar10 & uVar60) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar12;
    uVar38 = (uVar58 >> 3 ^ (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7))
             + uVar65 + uVar17 +
             (uVar32 >> 10 ^ (uVar32 * 0x2000 | uVar32 >> 0x13) ^ (uVar32 * 0x8000 | uVar32 >> 0x11)
             );
    iVar12 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
             (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
             uVar31 + uVar38 + ((uVar53 ^ uVar42) & uVar54 ^ uVar42) + 0x4ed8aa4a;
    uVar24 = uVar24 + iVar12;
    uVar31 = ((uVar61 | uVar10) & uVar60 | uVar61 & uVar10) +
             ((uVar61 * 0x400 | uVar61 >> 0x16) ^
             (uVar61 * 0x80000 | uVar61 >> 0xd) ^ (uVar61 * 0x40000000 | uVar61 >> 2)) + iVar12;
    uVar56 = (uVar11 >> 3 ^ (uVar11 * 0x4000 | uVar11 >> 0x12) ^ (uVar11 * 0x2000000 | uVar11 >> 7))
             + uVar58 + uVar28 +
             (uVar29 >> 10 ^ (uVar29 * 0x2000 | uVar29 >> 0x13) ^ (uVar29 * 0x8000 | uVar29 >> 0x11)
             );
    iVar12 = ((uVar24 * 0x80 | uVar24 >> 0x19) ^
             (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
             uVar42 + uVar56 + ((uVar54 ^ uVar53) & uVar24 ^ uVar53) + 0x5b9cca4f;
    uVar60 = uVar60 + iVar12;
    uVar26 = ((uVar31 | uVar61) & uVar10 | uVar31 & uVar61) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar12;
    uVar42 = (uVar41 >> 3 ^ (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7))
             + uVar11 + uVar49 +
             (uVar38 >> 10 ^ (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11)
             );
    iVar12 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
             (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
             uVar53 + uVar42 + ((uVar24 ^ uVar54) & uVar60 ^ uVar54) + 0x682e6ff3;
    uVar10 = uVar10 + iVar12;
    uVar53 = ((uVar26 | uVar31) & uVar61 | uVar26 & uVar31) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar12;
    uVar57 = (uVar43 >> 3 ^ (uVar43 * 0x4000 | uVar43 >> 0x12) ^ (uVar43 * 0x2000000 | uVar43 >> 7))
             + uVar41 + uVar15 +
             (uVar56 >> 10 ^ (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11)
             );
    iVar12 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
             uVar54 + uVar57 + ((uVar60 ^ uVar24) & uVar10 ^ uVar24) + 0x748f82ee;
    uVar61 = uVar61 + iVar12;
    uVar15 = ((uVar53 | uVar26) & uVar31 | uVar53 & uVar26) +
             ((uVar53 * 0x400 | uVar53 >> 0x16) ^
             (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar12;
    uVar41 = (uVar16 >> 3 ^ (uVar16 * 0x4000 | uVar16 >> 0x12) ^ (uVar16 * 0x2000000 | uVar16 >> 7))
             + uVar43 + uVar27 +
             (uVar42 >> 10 ^ (uVar42 * 0x2000 | uVar42 >> 0x13) ^ (uVar42 * 0x8000 | uVar42 >> 0x11)
             );
    iVar12 = ((uVar61 * 0x80 | uVar61 >> 0x19) ^
             (uVar61 * 0x200000 | uVar61 >> 0xb) ^ (uVar61 * 0x4000000 | uVar61 >> 6)) +
             uVar24 + uVar41 + ((uVar10 ^ uVar60) & uVar61 ^ uVar60) + 0x78a5636f;
    uVar31 = uVar31 + iVar12;
    uVar43 = ((uVar15 | uVar53) & uVar26 | uVar15 & uVar53) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    uVar27 = (uVar35 >> 3 ^ (uVar35 * 0x4000 | uVar35 >> 0x12) ^ (uVar35 * 0x2000000 | uVar35 >> 7))
             + uVar16 + uVar32 +
             (uVar57 >> 10 ^ (uVar57 * 0x2000 | uVar57 >> 0x13) ^ (uVar57 * 0x8000 | uVar57 >> 0x11)
             );
    iVar12 = ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             uVar60 + uVar27 + ((uVar61 ^ uVar10) & uVar31 ^ uVar10) + -0x7b3787ec;
    uVar26 = uVar26 + iVar12;
    uVar16 = ((uVar43 | uVar15) & uVar53 | uVar43 & uVar15) +
             ((uVar43 * 0x400 | uVar43 >> 0x16) ^
             (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar12;
    uVar32 = (uVar47 >> 3 ^ (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7))
             + uVar35 + uVar29 +
             (uVar41 >> 10 ^ (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11)
             );
    iVar12 = ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             uVar10 + uVar32 + ((uVar31 ^ uVar61) & uVar26 ^ uVar61) + -0x7338fdf8;
    uVar53 = uVar53 + iVar12;
    uVar41 = ((uVar16 | uVar43) & uVar15 | uVar16 & uVar43) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar12;
    uVar10 = (uVar13 >> 3 ^ (uVar13 * 0x4000 | uVar13 >> 0x12) ^ (uVar13 * 0x2000000 | uVar13 >> 7))
             + uVar47 + uVar38 +
             (uVar27 >> 10 ^ (uVar27 * 0x2000 | uVar27 >> 0x13) ^ (uVar27 * 0x8000 | uVar27 >> 0x11)
             );
    iVar12 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
             (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
             uVar61 + uVar10 + ((uVar26 ^ uVar31) & uVar53 ^ uVar31) + -0x6f410006;
    uVar15 = uVar15 + iVar12;
    uVar38 = ((uVar41 | uVar16) & uVar43 | uVar41 & uVar16) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar12;
    uVar13 = (uVar17 >> 3 ^ (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7))
             + uVar13 + uVar56 +
             (uVar32 >> 10 ^ (uVar32 * 0x2000 | uVar32 >> 0x13) ^ (uVar32 * 0x8000 | uVar32 >> 0x11)
             );
    iVar12 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             uVar31 + uVar13 + ((uVar53 ^ uVar26) & uVar15 ^ uVar26) + -0x5baf9315;
    uVar43 = uVar43 + iVar12;
    uVar27 = ((uVar38 | uVar41) & uVar16 | uVar38 & uVar41) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar12;
    iVar12 = ((uVar43 * 0x80 | uVar43 >> 0x19) ^
             (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
             (uVar28 >> 3 ^ (uVar28 * 0x4000 | uVar28 >> 0x12) ^ (uVar28 * 0x2000000 | uVar28 >> 7))
             + uVar17 + uVar42 +
             (uVar10 >> 10 ^ (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11)
             ) + uVar26 + ((uVar15 ^ uVar53) & uVar43 ^ uVar53) + -0x41065c09;
    uVar16 = uVar16 + iVar12;
    uVar26 = ((uVar27 | uVar38) & uVar41 | uVar27 & uVar38) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar12;
    iVar12 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
             (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
             (uVar49 >> 3 ^ (uVar49 * 0x4000 | uVar49 >> 0x12) ^ (uVar49 * 0x2000000 | uVar49 >> 7))
             + uVar28 + uVar57 +
             (uVar13 >> 10 ^ (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11)
             ) + uVar53 + ((uVar43 ^ uVar15) & uVar16 ^ uVar15) + -0x398e870e;
    hash->s[0] = ((uVar26 | uVar27) & uVar38 | uVar26 & uVar27) + uVar1 +
                 ((uVar26 * 0x400 | uVar26 >> 0x16) ^
                 (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar12;
    hash->s[1] = uVar26 + uVar2;
    hash->s[2] = uVar27 + uVar3;
    hash->s[3] = uVar38 + uVar4;
    hash->s[4] = uVar41 + uVar5 + iVar12;
    hash->s[5] = uVar16 + uVar6;
    hash->s[6] = uVar43 + uVar7;
    hash->s[7] = uVar15 + uVar8;
    uVar36 = 0;
  }
  if (len != 0) {
    memcpy((void *)((long)hash->buf + uVar36),local_d0,len);
    return;
  }
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    while (bufsize + len >= 64) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(((unsigned char*)hash->buf) + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}